

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRobustnessTests.cpp
# Opt level: O2

void __thiscall
deqp::egl::anon_unknown_1::QueryObjectResetCase::provokeReset
          (QueryObjectResetCase *this,
          SharedPtr<deqp::egl::(anonymous_namespace)::ContextReset> *contextReset)

{
  ostringstream *this_00;
  ContextReset *pCVar1;
  GLenum GVar2;
  undefined1 local_198 [384];
  
  local_198._0_8_ =
       ((this->super_ContextResetCase).super_RobustnessTestCase.super_TestCase.super_TestCase.
        super_TestNode.m_testCtx)->m_log;
  this_00 = (ostringstream *)(local_198 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,
                  "Check the status of a query object after a context reset returned by glGetQueryObjectuiv() equals GL_TRUE\n\n"
                 );
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_198,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  (*contextReset->m_ptr->_vptr_ContextReset[2])();
  pCVar1 = contextReset->m_ptr;
  (*pCVar1->m_gl->genQueries)(1,&pCVar1->m_queryID);
  GVar2 = (*pCVar1->m_gl->getError)();
  glu::checkError(GVar2,"genQueries(1, &m_queryID)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x29c);
  (*pCVar1->m_gl->beginQuery)(0x8c2f,pCVar1->m_queryID);
  GVar2 = (*pCVar1->m_gl->getError)();
  glu::checkError(GVar2,"beginQuery(GL_ANY_SAMPLES_PASSED, m_queryID)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRobustnessTests.cpp"
                  ,0x29d);
  (*contextReset->m_ptr->_vptr_ContextReset[3])();
  return;
}

Assistant:

virtual void provokeReset (de::SharedPtr<ContextReset>& contextReset)
	{
		m_testCtx.getLog()	<< tcu::TestLog::Message
							<< "Check the status of a query object after a context reset returned by glGetQueryObjectuiv() equals GL_TRUE\n\n"
							<< tcu::TestLog::EndMessage;

		contextReset->setup();
		contextReset->beginQuery();
		contextReset->draw();
	}